

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Thread::Push(Thread *this,Ref ref)

{
  anon_union_16_6_113bff37_for_Value_0 local_28;
  
  local_28.i32_ =
       (int)((ulong)((long)(this->values_).
                           super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->values_).
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->refs_,&local_28.i32_);
  local_28._8_8_ = 0;
  local_28.ref_.index = (Ref)ref.index;
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::
  emplace_back<wabt::interp::Value>(&this->values_,(Value *)&local_28.v128_);
  return;
}

Assistant:

void Thread::Push(Ref ref) {
  refs_.push_back(values_.size());
  values_.push_back(Value::Make(ref));
}